

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<unsigned_long,unsigned_long>
               (TestResults *results,unsigned_long *expected,unsigned_long *actual,
               TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream local_1c0;
  
  if (*expected != *actual) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    poVar1 = std::operator<<((ostream *)&local_1c0,"Expected ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," but was ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}